

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfFile.cpp
# Opt level: O0

void __thiscall ElfFile::loadElfHeader(ElfFile *this)

{
  Endianness endianness_00;
  int iVar1;
  Elf32_Word EVar2;
  Elf32_Addr EVar3;
  Elf32_Off EVar4;
  byte *pbVar5;
  Endianness endianness;
  ElfFile *this_local;
  
  pbVar5 = ByteArray::operator[](&this->fileData,0);
  *(undefined8 *)(this->fileHeader).e_ident = *(undefined8 *)pbVar5;
  *(undefined8 *)((this->fileHeader).e_ident + 8) = *(undefined8 *)(pbVar5 + 8);
  endianness_00 = getEndianness(this);
  iVar1 = ByteArray::getWord(&this->fileData,0x10,endianness_00);
  (this->fileHeader).e_type = (Elf32_Half)iVar1;
  iVar1 = ByteArray::getWord(&this->fileData,0x12,endianness_00);
  (this->fileHeader).e_machine = (Elf32_Half)iVar1;
  EVar2 = ByteArray::getDoubleWord(&this->fileData,0x14,endianness_00);
  (this->fileHeader).e_version = EVar2;
  EVar3 = ByteArray::getDoubleWord(&this->fileData,0x18,endianness_00);
  (this->fileHeader).e_entry = EVar3;
  EVar4 = ByteArray::getDoubleWord(&this->fileData,0x1c,endianness_00);
  (this->fileHeader).e_phoff = EVar4;
  EVar4 = ByteArray::getDoubleWord(&this->fileData,0x20,endianness_00);
  (this->fileHeader).e_shoff = EVar4;
  EVar2 = ByteArray::getDoubleWord(&this->fileData,0x24,endianness_00);
  (this->fileHeader).e_flags = EVar2;
  iVar1 = ByteArray::getWord(&this->fileData,0x28,endianness_00);
  (this->fileHeader).e_ehsize = (Elf32_Half)iVar1;
  iVar1 = ByteArray::getWord(&this->fileData,0x2a,endianness_00);
  (this->fileHeader).e_phentsize = (Elf32_Half)iVar1;
  iVar1 = ByteArray::getWord(&this->fileData,0x2c,endianness_00);
  (this->fileHeader).e_phnum = (Elf32_Half)iVar1;
  iVar1 = ByteArray::getWord(&this->fileData,0x2e,endianness_00);
  (this->fileHeader).e_shentsize = (Elf32_Half)iVar1;
  iVar1 = ByteArray::getWord(&this->fileData,0x30,endianness_00);
  (this->fileHeader).e_shnum = (Elf32_Half)iVar1;
  iVar1 = ByteArray::getWord(&this->fileData,0x32,endianness_00);
  (this->fileHeader).e_shstrndx = (Elf32_Half)iVar1;
  return;
}

Assistant:

void ElfFile::loadElfHeader()
{
	memcpy(fileHeader.e_ident, &fileData[0], sizeof(fileHeader.e_ident));
	Endianness endianness = getEndianness();
	fileHeader.e_type = fileData.getWord(0x10, endianness);
	fileHeader.e_machine = fileData.getWord(0x12, endianness);
	fileHeader.e_version = fileData.getDoubleWord(0x14, endianness);
	fileHeader.e_entry = fileData.getDoubleWord(0x18, endianness);
	fileHeader.e_phoff = fileData.getDoubleWord(0x1C, endianness);
	fileHeader.e_shoff = fileData.getDoubleWord(0x20, endianness);
	fileHeader.e_flags = fileData.getDoubleWord(0x24, endianness);
	fileHeader.e_ehsize = fileData.getWord(0x28, endianness);
	fileHeader.e_phentsize = fileData.getWord(0x2A, endianness);
	fileHeader.e_phnum = fileData.getWord(0x2C, endianness);
	fileHeader.e_shentsize = fileData.getWord(0x2E, endianness);
	fileHeader.e_shnum = fileData.getWord(0x30, endianness);
	fileHeader.e_shstrndx = fileData.getWord(0x32, endianness);
}